

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O3

QDataStream * __thiscall QDataStream::operator>>(QDataStream *this,qint32 *i)

{
  qint64 qVar1;
  uint uVar2;
  
  *i = 0;
  if (this->dev != (QIODevice *)0x0) {
    qVar1 = readBlock(this,(char *)i,4);
    uVar2 = 0;
    if (qVar1 == 4) {
      if (this->noswap != false) {
        return this;
      }
      uVar2 = *i;
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
    *i = uVar2;
  }
  return this;
}

Assistant:

QDataStream &QDataStream::operator>>(qint32 &i)
{
    i = 0;
    CHECK_STREAM_PRECOND(*this)
    if (readBlock(reinterpret_cast<char *>(&i), 4) != 4) {
        i = 0;
    } else {
        if (!noswap) {
            i = qbswap(i);
        }
    }
    return *this;
}